

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_client_read(Curl_easy *data,char *buf,size_t blen,size_t *nread,_Bool *eos)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  ulong uVar3;
  Curl_creader *pCVar4;
  
  pCVar4 = (data->req).reader_stack;
  if (pCVar4 == (Curl_creader *)0x0) {
    CVar2 = Curl_creader_set_fread(data,(data->state).infilesize);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pCVar4 = (data->req).reader_stack;
    *nread = 0;
    *eos = false;
    if (pCVar4 == (Curl_creader *)0x0) {
      uVar3 = 0x1a;
      goto LAB_0014d259;
    }
  }
  else {
    *nread = 0;
    *eos = false;
  }
  CVar2 = (*pCVar4->crt->do_read)(data,pCVar4,buf,blen,nread,eos);
  uVar3 = (ulong)CVar2;
LAB_0014d259:
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
      (0 < Curl_trc_feat_read.log_level)))) {
    Curl_trc_read(data,"client_read(len=%zu) -> %d, nread=%zu, eos=%d",blen,uVar3,*nread,(ulong)*eos
                 );
  }
  return (CURLcode)uVar3;
}

Assistant:

CURLcode Curl_client_read(struct Curl_easy *data, char *buf, size_t blen,
                          size_t *nread, bool *eos)
{
  CURLcode result;

  DEBUGASSERT(buf);
  DEBUGASSERT(blen);
  DEBUGASSERT(nread);
  DEBUGASSERT(eos);

  if(!data->req.reader_stack) {
    result = Curl_creader_set_fread(data, data->state.infilesize);
    if(result)
      return result;
    DEBUGASSERT(data->req.reader_stack);
  }

  result = Curl_creader_read(data, data->req.reader_stack, buf, blen,
                             nread, eos);
  CURL_TRC_READ(data, "client_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *nread, *eos);
  return result;
}